

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

ValueVectorOf<xercesc_4_0::PrefMapElem_*> * __thiscall
xercesc_4_0::ElemStack::getNamespaceMap(ElemStack *this)

{
  PrefMapElem *local_40;
  ulong local_38;
  XMLSize_t mapIndex_1;
  ulong local_28;
  XMLSize_t mapIndex;
  StackElem *curRow;
  XMLSize_t index;
  ElemStack *this_local;
  
  index = (XMLSize_t)this;
  ValueVectorOf<xercesc_4_0::PrefMapElem_*>::removeAllElements(this->fNamespaceMap);
  for (curRow = (StackElem *)this->fStackTop; curRow != (StackElem *)0x0;
      curRow = (StackElem *)&curRow[-1].field_0x6f) {
    mapIndex = (XMLSize_t)this->fStack[(long)&curRow[-1].field_0x6f];
    if (((StackElem *)mapIndex)->fMapCount != 0) {
      for (local_28 = 0; local_28 < *(ulong *)(mapIndex + 0x38); local_28 = local_28 + 1) {
        mapIndex_1 = *(long *)(mapIndex + 0x28) + local_28 * 8;
        ValueVectorOf<xercesc_4_0::PrefMapElem_*>::addElement
                  (this->fNamespaceMap,(PrefMapElem **)&mapIndex_1);
      }
    }
  }
  if (this->fGlobalNamespaces != (StackElem *)0x0) {
    for (local_38 = 0; local_38 < this->fGlobalNamespaces->fMapCount; local_38 = local_38 + 1) {
      local_40 = this->fGlobalNamespaces->fMap + local_38;
      ValueVectorOf<xercesc_4_0::PrefMapElem_*>::addElement(this->fNamespaceMap,&local_40);
    }
  }
  return this->fNamespaceMap;
}

Assistant:

ValueVectorOf<PrefMapElem*>* ElemStack::getNamespaceMap() const
{
    fNamespaceMap->removeAllElements();

    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    for (XMLSize_t index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // If no prefixes mapped at this level, then go the next one
        if (!curRow->fMapCount)
            continue;

        // Search the map at this level for the passed prefix
        for (XMLSize_t mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
            fNamespaceMap->addElement(&(curRow->fMap[mapIndex]));
    }
    //  Add the global namespaces
    if(fGlobalNamespaces)
    {
        for (XMLSize_t mapIndex = 0; mapIndex < fGlobalNamespaces->fMapCount; mapIndex++)
            fNamespaceMap->addElement(&(fGlobalNamespaces->fMap[mapIndex]));
    }

    return fNamespaceMap;
}